

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_construct.cc
# Opt level: O0

void __thiscall re2c::Cases::add(Cases *this,uint32_t lb,uint32_t ub,State *to)

{
  uint uVar1;
  Case *pCVar2;
  ulong uVar3;
  pair<unsigned_int,_unsigned_int> local_34;
  pair<unsigned_int,_unsigned_int> local_2c;
  uint local_24;
  State *pSStack_20;
  uint32_t i;
  State *to_local;
  uint32_t ub_local;
  uint32_t lb_local;
  Cases *this_local;
  
  local_24 = 0;
  while( true ) {
    pSStack_20 = to;
    to_local._0_4_ = ub;
    to_local._4_4_ = lb;
    _ub_local = this;
    if (this->cases_size <= local_24) {
      pCVar2 = this->cases;
      uVar1 = this->cases_size;
      local_34 = std::make_pair<unsigned_int&,unsigned_int&>
                           ((uint *)((long)&to_local + 4),(uint *)&to_local);
      std::
      vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ::push_back(&pCVar2[uVar1].ranges,&local_34);
      this->cases[this->cases_size].to = pSStack_20;
      this->cases_size = this->cases_size + 1;
      return;
    }
    if (this->cases[local_24].to == to) break;
    local_24 = local_24 + 1;
  }
  pCVar2 = this->cases;
  uVar3 = (ulong)local_24;
  local_2c = std::make_pair<unsigned_int&,unsigned_int&>
                       ((uint *)((long)&to_local + 4),(uint *)&to_local);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::push_back(&pCVar2[uVar3].ranges,&local_2c);
  return;
}

Assistant:

void Cases::add (uint32_t lb, uint32_t ub, State * to)
{
	for (uint32_t i = 0; i < cases_size; ++i)
	{
		if (cases[i].to == to)
		{
			cases[i].ranges.push_back (std::make_pair (lb, ub));
			return;
		}
	}
	cases[cases_size].ranges.push_back (std::make_pair (lb, ub));
	cases[cases_size].to = to;
	++cases_size;
}